

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O3

void ucnv_getInvalidUChars_63(UConverter *converter,UChar *errChars,int8_t *len,UErrorCode *err)

{
  char cVar1;
  
  if ((err != (UErrorCode *)0x0) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((converter == (UConverter *)0x0) || ((errChars == (UChar *)0x0 || (len == (int8_t *)0x0))))
    {
      *err = U_ILLEGAL_ARGUMENT_ERROR;
      return;
    }
    cVar1 = converter->invalidUCharLength;
    if (*len < cVar1) {
      *err = U_INDEX_OUTOFBOUNDS_ERROR;
      return;
    }
    *len = cVar1;
    if ('\0' < cVar1) {
      u_memcpy_63(errChars,converter->invalidUCharBuffer,(int)cVar1);
      return;
    }
  }
  return;
}

Assistant:

U_CAPI void  U_EXPORT2
ucnv_getInvalidUChars (const UConverter * converter,
                       UChar *errChars,
                       int8_t * len,
                       UErrorCode * err)
{
    if (err == NULL || U_FAILURE(*err))
    {
        return;
    }
    if (len == NULL || errChars == NULL || converter == NULL)
    {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    if (*len < converter->invalidUCharLength)
    {
        *err = U_INDEX_OUTOFBOUNDS_ERROR;
        return;
    }
    if ((*len = converter->invalidUCharLength) > 0)
    {
        u_memcpy (errChars, converter->invalidUCharBuffer, *len);
    }
}